

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

bool __thiscall
cornerstone::raft_server::replicate_log
          (raft_server *this,bufptr *log,ptr<void> *cookie,uint cookie_tag)

{
  _func_int *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  log_entry_cookie *__ptr;
  element_type *peVar3;
  buffer *pbVar4;
  bool bVar5;
  int iVar6;
  pointer __p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _func_int **pp_Var8;
  ptr<log_entry> entry;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  log_entry_cookie *local_38;
  
  bVar5 = is_leader(this);
  if (bVar5) {
    pp_Var8 = (_func_int **)
              ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->term_;
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00178648;
    local_48 = p_Var7 + 1;
    p_Var7[1]._vptr__Sp_counted_base = pp_Var8;
    p_Var7[1]._M_use_count = 1;
    pbVar4 = (log->_M_t).super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>
             ._M_t.super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
             super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl;
    p_Var7[2]._vptr__Sp_counted_base =
         (_func_int **)
         (log->_M_t).super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>.
         _M_t.super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
         super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
         super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl;
    *(buffer **)&p_Var7[2]._M_use_count = pbVar4;
    (log->_M_t).super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
    super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
    super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = (buffer *)0x0;
    p_Var7[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var1 = (_func_int *)(cookie->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40 = p_Var7;
    if (p_Var1 != (_func_int *)0x0) {
      pp_Var8 = (_func_int **)operator_new(0x18);
      *(uint *)pp_Var8 = cookie_tag;
      pp_Var8[1] = p_Var1;
      p_Var2 = (cookie->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      pp_Var8[2] = (_func_int *)p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      local_38 = (log_entry_cookie *)0x0;
      __ptr = (log_entry_cookie *)p_Var7[3]._vptr__Sp_counted_base;
      p_Var7[3]._vptr__Sp_counted_base = pp_Var8;
      if (__ptr != (log_entry_cookie *)0x0) {
        std::default_delete<cornerstone::log_entry_cookie>::operator()
                  ((default_delete<cornerstone::log_entry_cookie> *)(p_Var7 + 3),__ptr);
      }
      if (local_38 != (log_entry_cookie *)0x0) {
        std::default_delete<cornerstone::log_entry_cookie>::operator()
                  ((default_delete<cornerstone::log_entry_cookie> *)&local_38,local_38);
      }
    }
    peVar3 = (this->log_store_).
             super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_log_store[5])(peVar3,&local_48);
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    request_append_entries(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
  }
  return false;
}

Assistant:

bool raft_server::replicate_log(bufptr& log, const ptr<void>& cookie, uint cookie_tag)
{
    if (!is_leader())
    {
        return false;
    }

    ptr<log_entry> entry = cs_new<log_entry>(state_->get_term(), std::move(log));
    if (cookie)
    {
        entry->set_cookie(cookie_tag, cookie);
    }

    log_store_->append(entry);
    {
        recur_lock(lock_);
        request_append_entries();
    }

    return false;
}